

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O2

void setter_thread_body(void *arg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uStack_30;
  
  iVar2 = 0x33;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return;
    }
    iVar1 = uv_set_process_title
                      ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled")
    ;
    if (iVar1 != 0) {
      pcVar3 = "0 == uv_set_process_title(titles[0])";
      uStack_30 = 0x3d;
      goto LAB_001428d0;
    }
    iVar1 = uv_set_process_title
                      ("jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82")
    ;
    if (iVar1 != 0) {
      pcVar3 = "0 == uv_set_process_title(titles[1])";
      uStack_30 = 0x3e;
      goto LAB_001428d0;
    }
    iVar1 = uv_set_process_title
                      ("9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT")
    ;
    if (iVar1 != 0) {
      pcVar3 = "0 == uv_set_process_title(titles[2])";
      uStack_30 = 0x3f;
      goto LAB_001428d0;
    }
    iVar1 = uv_set_process_title
                      ("n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU")
    ;
  } while (iVar1 == 0);
  pcVar3 = "0 == uv_set_process_title(titles[3])";
  uStack_30 = 0x40;
LAB_001428d0:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

static void setter_thread_body(void* arg) {
  int i;

  for (i = 0; i < NUM_ITERATIONS; i++) {
    ASSERT(0 == uv_set_process_title(titles[0]));
    ASSERT(0 == uv_set_process_title(titles[1]));
    ASSERT(0 == uv_set_process_title(titles[2]));
    ASSERT(0 == uv_set_process_title(titles[3]));
  }
}